

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O0

Mat3x3d * __thiscall OpenMD::StuntDouble::getQuadrupole(StuntDouble *this)

{
  Snapshot *pSVar1;
  SquareMatrix3<double> *in_RSI;
  Mat3x3d *in_RDI;
  Mat3x3d *this_00;
  
  this_00 = in_RDI;
  pSVar1 = SnapshotManager::getCurrentSnapshot
                     ((SnapshotManager *)
                      (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                      [1][0]);
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
              *)((long)&(pSVar1->atomData).quadrupole.
                        super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                (long)(in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                      [0][2]),
             (long)*(int *)(in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                           data_[2]);
  SquareMatrix3<double>::SquareMatrix3(this_00,in_RSI);
  return in_RDI;
}

Assistant:

Mat3x3d getQuadrupole() {
      return ((snapshotMan_->getCurrentSnapshot())->*storage_)
          .quadrupole[localIndex_];
    }